

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_column_data_scan.cpp
# Opt level: O2

void __thiscall
duckdb::PhysicalColumnDataScan::BuildPipelines
          (PhysicalColumnDataScan *this,Pipeline *current,MetaPipeline *meta_pipeline)

{
  PhysicalOperatorType PVar1;
  bool bVar2;
  PipelineBuildState *this_00;
  type pPVar3;
  PhysicalOperator *pPVar4;
  InternalException *this_01;
  shared_ptr<duckdb::Pipeline,_true> delim_dependency;
  optional_ptr<duckdb::PhysicalOperator,_true> delim_sink;
  
  this_00 = MetaPipeline::GetState(meta_pipeline);
  PVar1 = (this->super_PhysicalOperator).type;
  if (1 < PVar1 - 0x19) {
    delim_dependency.internal.super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    if (PVar1 == CTE_SCAN) {
      ::std::
      _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::find(&(this_00->cte_dependencies)._M_h,(key_type *)&delim_dependency);
      enable_shared_from_this<duckdb::Pipeline>::shared_from_this
                ((enable_shared_from_this<duckdb::Pipeline> *)&delim_dependency);
      pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator*(&delim_dependency);
      PipelineBuildState::GetPipelineSink(this_00,pPVar3);
      Pipeline::AddDependency(current,&delim_dependency);
      PipelineBuildState::SetPipelineSource(this_00,current,&this->super_PhysicalOperator);
    }
    else {
      if (PVar1 != DELIM_SCAN) goto LAB_009e9b18;
      ::std::
      _Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::find((_Hashtable<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::reference_wrapper<duckdb::Pipeline>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<const_duckdb::PhysicalOperator>,_duckdb::ReferenceHashFunction<const_duckdb::PhysicalOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)this_00,(key_type *)&delim_dependency);
      enable_shared_from_this<duckdb::Pipeline>::shared_from_this
                ((enable_shared_from_this<duckdb::Pipeline> *)&delim_dependency);
      pPVar3 = shared_ptr<duckdb::Pipeline,_true>::operator*(&delim_dependency);
      delim_sink = PipelineBuildState::GetPipelineSink(this_00,pPVar3);
      pPVar4 = optional_ptr<duckdb::PhysicalOperator,_true>::operator->(&delim_sink);
      Pipeline::AddDependency(current,&delim_dependency);
      PipelineBuildState::SetPipelineSource(this_00,current,*(PhysicalOperator **)&pPVar4[1].type);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&delim_dependency.internal.
                super___shared_ptr<duckdb::Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  bVar2 = MetaPipeline::HasRecursiveCTE(meta_pipeline);
  if (!bVar2) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&delim_dependency,"Recursive CTE scan found without recursive CTE node",
               (allocator *)&delim_sink);
    InternalException::InternalException(this_01,(string *)&delim_dependency);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
LAB_009e9b18:
  PipelineBuildState::SetPipelineSource(this_00,current,&this->super_PhysicalOperator);
  return;
}

Assistant:

void PhysicalColumnDataScan::BuildPipelines(Pipeline &current, MetaPipeline &meta_pipeline) {
	// check if there is any additional action we need to do depending on the type
	auto &state = meta_pipeline.GetState();
	switch (type) {
	case PhysicalOperatorType::DELIM_SCAN: {
		auto entry = state.delim_join_dependencies.find(*this);
		D_ASSERT(entry != state.delim_join_dependencies.end());
		// this chunk scan introduces a dependency to the current pipeline
		// namely a dependency on the duplicate elimination pipeline to finish
		auto delim_dependency = entry->second.get().shared_from_this();
		auto delim_sink = state.GetPipelineSink(*delim_dependency);
		D_ASSERT(delim_sink);
		D_ASSERT(delim_sink->type == PhysicalOperatorType::LEFT_DELIM_JOIN ||
		         delim_sink->type == PhysicalOperatorType::RIGHT_DELIM_JOIN);
		auto &delim_join = delim_sink->Cast<PhysicalDelimJoin>();
		current.AddDependency(delim_dependency);
		state.SetPipelineSource(current, delim_join.distinct.Cast<PhysicalOperator>());
		return;
	}
	case PhysicalOperatorType::CTE_SCAN: {
		auto entry = state.cte_dependencies.find(*this);
		D_ASSERT(entry != state.cte_dependencies.end());
		// this chunk scan introduces a dependency to the current pipeline
		// namely a dependency on the CTE pipeline to finish
		auto cte_dependency = entry->second.get().shared_from_this();
		auto cte_sink = state.GetPipelineSink(*cte_dependency);
		(void)cte_sink;
		D_ASSERT(cte_sink);
		D_ASSERT(cte_sink->type == PhysicalOperatorType::CTE);
		current.AddDependency(cte_dependency);
		state.SetPipelineSource(current, *this);
		return;
	}
	case PhysicalOperatorType::RECURSIVE_RECURRING_CTE_SCAN:
	case PhysicalOperatorType::RECURSIVE_CTE_SCAN:
		if (!meta_pipeline.HasRecursiveCTE()) {
			throw InternalException("Recursive CTE scan found without recursive CTE node");
		}
		break;
	default:
		break;
	}
	D_ASSERT(children.empty());
	state.SetPipelineSource(current, *this);
}